

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlSAXUserParseMemory(xmlSAXHandlerPtr sax,void *user_data,char *buffer,int size)

{
  _xmlSAXHandler *p_Var1;
  xmlParserCtxtPtr ctxt;
  _xmlSAXHandler *p_Var2;
  uint uVar3;
  
  xmlInitParser();
  ctxt = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    p_Var1 = ctxt->sax;
    p_Var2 = (_xmlSAXHandler *)__xmlDefaultSAXHandler();
    if (p_Var1 != p_Var2) {
      (*xmlFree)(ctxt->sax);
    }
    ctxt->sax = sax;
    xmlDetectSAX2(ctxt);
    if (user_data != (void *)0x0) {
      ctxt->userData = user_data;
    }
    xmlParseDocument(ctxt);
    uVar3 = 0;
    if (ctxt->wellFormed == 0) {
      uVar3 = -(uint)(ctxt->errNo == 0) | ctxt->errNo;
    }
    if (sax != (xmlSAXHandlerPtr)0x0) {
      ctxt->sax = (_xmlSAXHandler *)0x0;
    }
    if (ctxt->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt->myDoc);
      ctxt->myDoc = (xmlDocPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return uVar3;
}

Assistant:

int xmlSAXUserParseMemory(xmlSAXHandlerPtr sax, void *user_data,
			  const char *buffer, int size) {
    int ret = 0;
    xmlParserCtxtPtr ctxt;

    xmlInitParser();

    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL) return -1;
    if (ctxt->sax != (xmlSAXHandlerPtr) &xmlDefaultSAXHandler)
        xmlFree(ctxt->sax);
    ctxt->sax = sax;
    xmlDetectSAX2(ctxt);

    if (user_data != NULL)
	ctxt->userData = user_data;

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = 0;
    else {
        if (ctxt->errNo != 0)
	    ret = ctxt->errNo;
	else
	    ret = -1;
    }
    if (sax != NULL)
        ctxt->sax = NULL;
    if (ctxt->myDoc != NULL) {
        xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return ret;
}